

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

pair<QPDFObjectHandle,_bool> *
QPDFParser::parse(pair<QPDFObjectHandle,_bool> *__return_storage_ptr__,OffsetBuffer *input,
                 int stream_id,int obj_id,Tokenizer *tokenizer,QPDF *context)

{
  allocator<char> local_129;
  string local_128;
  ObjStreamDescr local_108;
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  local_100;
  QPDFParser local_f0;
  undefined1 local_48 [8];
  QPDFObjectHandle result;
  bool empty;
  QPDF *context_local;
  Tokenizer *tokenizer_local;
  int obj_id_local;
  int stream_id_local;
  OffsetBuffer *input_local;
  
  result.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._7_1_ = 0;
  QPDFObject::ObjStreamDescr::ObjStreamDescr(&local_108,stream_id,obj_id);
  std::
  make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::ObjStreamDescr>
            ((ObjStreamDescr *)&local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_129);
  QPDFParser(&local_f0,&input->super_InputSource,&local_100,&local_128,tokenizer,
             (StringDecrypter *)0x0,context,true,stream_id,obj_id);
  parse((QPDFParser *)local_48,(bool *)&local_f0,(bool)((char)&result + '\x0f'));
  ~QPDFParser(&local_f0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::~shared_ptr(&local_100);
  std::pair<QPDFObjectHandle,_bool>::pair<QPDFObjectHandle_&,_bool_&,_true>
            (__return_storage_ptr__,(QPDFObjectHandle *)local_48,
             (bool *)((long)&result.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi + 7));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<QPDFObjectHandle, bool>
QPDFParser::parse(
    is::OffsetBuffer& input, int stream_id, int obj_id, qpdf::Tokenizer& tokenizer, QPDF& context)
{
    bool empty{false};
    auto result = QPDFParser(
                      input,
                      std::make_shared<QPDFObject::Description>(
                          QPDFObject::ObjStreamDescr(stream_id, obj_id)),
                      "",
                      tokenizer,
                      nullptr,
                      &context,
                      true,
                      stream_id,
                      obj_id)
                      .parse(empty, false);
    return {result, empty};
}